

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O2

double __thiscall libDAI::TRW::run(TRW *this)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  const_iterator pos;
  ostream *poVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var12;
  long lVar13;
  bool bVar14;
  _Self __tmp_1;
  char *pcVar15;
  _Rb_tree_node_base *p_Var16;
  const_iterator pos_1;
  _Rb_tree_node_base *p_Var17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
  alpha_gain;
  WeightedGraph<double> cur_rho;
  key_type_conflict1 local_128;
  double local_120;
  double local_118;
  double local_110;
  undefined1 local_108 [16];
  TRW *local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  _Base_ptr local_d8;
  undefined8 uStack_d0;
  double local_c0;
  WeightedGraph<double> *local_b8;
  ulong local_b0;
  _Rb_tree<double,_std::pair<const_double,_double>,_std::_Select1st<std::pair<const_double,_double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
  local_a8;
  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  local_78;
  double local_48;
  undefined8 uStack_40;
  
  if ((this->Props).verbose != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Starting ");
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])
              ((string *)&local_78,this);
    poVar9 = std::operator<<(poVar9,(string *)&local_78);
    poVar9 = std::operator<<(poVar9,"...");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&local_78);
  }
  (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xe])(this);
  dVar19 = inner_loop(this);
  (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])(this);
  p_Var1 = &local_a8._M_impl.super__Rb_tree_header;
  local_128 = 0.5;
  local_b8 = &this->_rho_e;
  local_b0 = 0;
  local_120 = dVar19;
  local_110 = dVar19;
  local_f8 = this;
  while (local_b0 < (this->Props).maxouteriter) {
    local_f0 = calc_rho_descent(this);
    if (1 < (this->Props).verbose) {
      poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar9 = std::operator<<(poVar9,"iter = ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::operator<<(poVar9,", cur_logZ = ");
      poVar9 = std::ostream::_M_insert<double>(local_110);
      std::operator<<(poVar9,", weight = ");
      poVar9 = std::ostream::_M_insert<double>(local_f0);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    if (NAN(local_f0)) {
      if ((this->Props).verbose != 0) {
        poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar9 = std::operator<<(poVar9,
                                 "Reached NAN! Not going further...you\'ll have to use the current result"
                                );
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      break;
    }
    std::
    _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ::_Rb_tree(&local_78,
               (_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                *)local_b8);
    local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    bVar14 = false;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    do {
      std::
      _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
      ::operator=((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                   *)local_b8,&local_78);
      if (2 < (this->Props).verbose) {
        std::operator<<((ostream *)&std::cout,"checking alpha = ");
        poVar9 = std::ostream::_M_insert<double>(local_128);
        poVar9 = std::operator<<(poVar9,"...");
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      update_rho_e(this,local_128);
      dVar19 = inner_loop(this);
      (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])(this);
      local_108._0_8_ = local_120 - dVar19;
      local_110 = dVar19;
      if (2 < (this->Props).verbose) {
        std::operator<<((ostream *)&std::cout,"  for alpha = ");
        poVar9 = std::ostream::_M_insert<double>(local_128);
        std::operator<<(poVar9,", gain = ");
        poVar9 = std::ostream::_M_insert<double>((double)local_108._0_8_);
        std::operator<<(poVar9," >=? alpha * weight = ");
        poVar9 = std::ostream::_M_insert<double>(local_f0 * local_128);
        std::operator<<(poVar9,", gain / (alpha * weight) = ");
        poVar9 = std::ostream::_M_insert<double>((double)local_108._0_8_ / (local_f0 * local_128));
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      if (bVar14) break;
      pmVar10 = std::
                map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                ::operator[]((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                              *)&local_a8,&local_128);
      *pmVar10 = (mapped_type)local_108._0_8_;
      p_Var11 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var12 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var16 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var17 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var11 != p_Var1;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        if (NAN((double)p_Var11[1]._M_parent)) {
          if ((_Rb_tree_header *)p_Var17 == p_Var1) {
            p_Var17 = p_Var11;
          }
        }
        else {
          p_Var16 = p_Var11;
          if ((double)p_Var12[1]._M_parent < (double)p_Var11[1]._M_parent) {
            p_Var12 = p_Var11;
          }
        }
      }
      iVar8 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      p_Var11 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (2 < CONCAT44(extraout_var,iVar8)) {
        for (; (_Rb_tree_header *)p_Var11 != p_Var1;
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
          poVar9 = std::operator<<((ostream *)&std::cout,"      ");
          pcVar15 = " ";
          if (p_Var11 == p_Var12) {
            pcVar15 = "*";
          }
          std::operator<<(poVar9,pcVar15);
          poVar9 = std::ostream::_M_insert<double>(*(double *)(p_Var11 + 1));
          std::operator<<(poVar9," ");
          poVar9 = std::ostream::_M_insert<double>((double)p_Var11[1]._M_parent);
          std::endl<char,std::char_traits<char>>(poVar9);
        }
      }
      if (p_Var12 == local_a8._M_impl.super__Rb_tree_header._M_header._M_left) {
        local_128 = *(key_type_conflict1 *)(p_Var12 + 1);
LAB_005032b1:
        local_128 = local_128 * 0.5;
        bVar14 = false;
        this = local_f8;
      }
      else {
        if (p_Var12 == p_Var16) {
          if ((_Rb_tree_header *)p_Var17 == p_Var1) {
            local_128 = 1.0;
          }
          else {
            local_128 = *(key_type_conflict1 *)(p_Var17 + 1);
          }
          local_128 = local_128 + *(double *)(p_Var12 + 1);
          goto LAB_005032b1;
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var12);
        local_e0 = *(double *)(p_Var12 + 1);
        local_d8 = p_Var12[1]._M_parent;
        uStack_d0 = 0;
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        local_e8 = *(double *)(p_Var12 + 1);
        local_108._8_8_ = 0;
        local_108._0_8_ = p_Var12[1]._M_parent;
        lVar13 = std::_Rb_tree_increment(p_Var12);
        this = local_f8;
        local_118 = *(double *)(lVar13 + 0x28);
        local_c0 = *(double *)(lVar13 + 0x20);
        local_48 = local_c0 - local_e0;
        uStack_40 = 0;
        dVar19 = local_e8;
        if ((((local_f8->Props).tol <= local_48) && (local_108._0_8_ < (double)local_d8)) &&
           (local_108._0_8_ < local_118)) {
          if (2 < (local_f8->Props).verbose) {
            std::operator<<((ostream *)&std::cout,"  fitting parabola through ");
            *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 0xf;
            std::operator<<((ostream *)&std::cout,"(x1,y1) = (");
            poVar9 = std::ostream::_M_insert<double>(local_e0);
            std::operator<<(poVar9,",");
            poVar9 = std::ostream::_M_insert<double>((double)local_d8);
            std::operator<<(poVar9,"), ");
            std::operator<<((ostream *)&std::cout,"(x2,y2) = (");
            poVar9 = std::ostream::_M_insert<double>(local_e8);
            std::operator<<(poVar9,",");
            poVar9 = std::ostream::_M_insert<double>((double)local_108._0_8_);
            std::operator<<(poVar9,"), ");
            std::operator<<((ostream *)&std::cout,"(x3,y3) = (");
            poVar9 = std::ostream::_M_insert<double>(local_c0);
            std::operator<<(poVar9,",");
            poVar9 = std::ostream::_M_insert<double>(local_118);
            poVar9 = std::operator<<(poVar9,").");
            std::endl<char,std::char_traits<char>>(poVar9);
          }
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_e0;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_c0;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_e0 * local_e0;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_118 - (double)local_108._0_8_;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_e8 * local_e8 * ((double)local_d8 - local_118);
          auVar18 = vfmadd231sd_fma(auVar25,auVar24,auVar18);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_e8 * ((double)local_d8 - local_118);
          auVar24 = vfmadd231sd_fma(auVar30,auVar29,auVar24);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_c0 * local_c0;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = (double)local_108._0_8_ - (double)local_d8;
          auVar18 = vfmadd213sd_fma(auVar21,auVar27,auVar18);
          auVar24 = vfmadd231sd_fma(auVar24,auVar28,auVar27);
          dVar19 = (auVar18._0_8_ * 0.5) / auVar24._0_8_;
        }
        bVar14 = true;
        local_128 = dVar19;
        if (local_c0 < dVar19) {
          *(undefined8 *)(std::__cxx11::string::append + *(long *)(std::cerr + -0x18)) = 0xf;
          std::operator<<((ostream *)&std::cerr,"alpha = ");
          poVar9 = std::ostream::_M_insert<double>(local_128);
          std::endl<char,std::char_traits<char>>(poVar9);
          std::operator<<((ostream *)&std::cerr,"(x1,y1) = (");
          poVar9 = std::ostream::_M_insert<double>(local_e0);
          std::operator<<(poVar9,",");
          poVar9 = std::ostream::_M_insert<double>((double)local_d8);
          std::operator<<(poVar9,"), ");
          std::operator<<((ostream *)&std::cerr,"(x2,y2) = (");
          poVar9 = std::ostream::_M_insert<double>(local_e8);
          std::operator<<(poVar9,",");
          poVar9 = std::ostream::_M_insert<double>((double)local_108._0_8_);
          std::operator<<(poVar9,"), ");
          std::operator<<((ostream *)&std::cerr,"(x3,y3) = (");
          poVar9 = std::ostream::_M_insert<double>(local_c0);
          std::operator<<(poVar9,",");
          poVar9 = std::ostream::_M_insert<double>(local_118);
          poVar9 = std::operator<<(poVar9,").");
          std::endl<char,std::char_traits<char>>(poVar9);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = (this->Props).tol;
          auVar7._8_8_ = uStack_40;
          auVar7._0_8_ = local_48;
          uVar2 = vcmppd_avx512vl(auVar26,auVar7,10);
          pcVar15 = "used alpha = x2";
          auVar6._8_8_ = uStack_d0;
          auVar6._0_8_ = local_d8;
          uVar3 = vcmppd_avx512vl(local_108,auVar6,1);
          if (local_108._0_8_ < local_118) {
            pcVar15 = "fitted parabola";
          }
          if ((((byte)uVar2 & 3) & uVar3 & 1) == 0) {
            pcVar15 = "used alpha = x2";
          }
          poVar9 = std::operator<<((ostream *)&std::cerr,pcVar15);
          std::endl<char,std::char_traits<char>>(poVar9);
        }
      }
      dVar19 = (this->Props).tol;
      if (local_128 < dVar19) {
        local_128 = 0.0;
        std::
        _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
        ::operator=((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                     *)local_b8,&local_78);
        dVar20 = inner_loop(this);
        (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])(this);
        dVar19 = (this->Props).tol;
        local_110 = dVar20;
      }
    } while (dVar19 < local_128);
    if (2 < (this->Props).verbose) {
      std::operator<<((ostream *)&std::cout,"Accepted alpha = ");
      poVar9 = std::ostream::_M_insert<double>(local_128);
      std::operator<<(poVar9,", this gives improvement of logZ of ");
      poVar9 = std::ostream::_M_insert<double>(local_120 - local_110);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    local_d8 = (_Base_ptr)(this->Props).outertol;
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_110 - local_120;
    local_108 = vandpd_avx512vl(auVar22,auVar4);
    dVar19 = local_110;
    if ((local_108._0_8_ < (double)local_d8) && (dVar19 = local_120, (this->Props).verbose != 0)) {
      poVar9 = std::operator<<((ostream *)&std::cout,"Reached tolerance! Ready!");
      std::endl<char,std::char_traits<char>>(poVar9);
      dVar19 = local_120;
    }
    local_118 = dVar19;
    std::
    _Rb_tree<double,_std::pair<const_double,_double>,_std::_Select1st<std::pair<const_double,_double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
    ::~_Rb_tree(&local_a8);
    std::
    _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
    ::~_Rb_tree(&local_78);
    local_b0 = local_b0 + 1;
    local_120 = local_118;
    if ((double)local_108._0_8_ < (double)local_d8) break;
  }
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_110 - local_120;
  auVar18 = vandpd_avx512vl(auVar23,auVar5);
  return auVar18._0_8_;
}

Assistant:

double TRW::run() {
        if( Props.verbose >= 1 )
            cout << "Starting " << identify() << "..." << endl;

        init();

        inner_loop();

        double prev_logZ = real(logZ());
        double cur_logZ = prev_logZ;
        double alpha = 0.5;
        for( size_t iter = 0; iter < Props.maxouteriter; iter++ ) {
            double weight = calc_rho_descent();
            // weight = - <nabla f, \tilde rho_e_descent>

            if( Props.verbose >= 2 )
                cout << endl << "iter = " << iter << ", cur_logZ = " << cur_logZ << ", weight = " << weight << endl;
            if( std::isnan( weight ) ) {
                if( Props.verbose >= 1 )
                    cout << endl << "Reached NAN! Not going further...you'll have to use the current result" << endl;
                break;  // don't proceed, as this will lead to even more nan's
            }

            WeightedGraph<double> cur_rho = _rho_e;
            map<double,double> alpha_gain;
            bool ready = false;
            do {
                _rho_e = cur_rho;
                if( Props.verbose >= 3 )
                    cout << "checking alpha = " << alpha << "..." << endl;
                update_rho_e(alpha); // rho_e = (1-alpha) cur_rho + alpha rho_descent

                // calculate everything at rho_e
                inner_loop();

                cur_logZ = real(logZ());
                double gain = prev_logZ - cur_logZ;  // should be positive
                if( Props.verbose >= 3 )
                    cout << "  for alpha = " << alpha << ", gain = " << gain << " >=? alpha * weight = " << alpha * weight << ", gain / (alpha * weight) = " << gain / (alpha * weight) << endl;

                if( ready )
                    break;

                alpha_gain[alpha] = gain;

                map<double,double>::const_iterator best = alpha_gain.begin();       // alpha with highest gain
                map<double,double>::const_iterator nan = alpha_gain.end();          // lowest alpha with gain==NAN
                map<double,double>::const_iterator last = alpha_gain.begin();       // highest alpha with gain!=NAN
                for( map<double,double>::const_iterator pos = alpha_gain.begin(); pos != alpha_gain.end(); pos++ ) {
                    if( std::isnan(pos->second) ) {
                        if( nan == alpha_gain.end() )
                            nan = pos;
                    } else {
                        last = pos;
                        if( pos->second > best->second )
                            best = pos;
                    }
                }
                if( Verbose() >= 3 )
                    for( map<double,double>::const_iterator pos = alpha_gain.begin(); pos != alpha_gain.end(); pos++ )
                        cout << "      " << ((pos == best) ? "*" : " ") << pos->first << " " << pos->second << endl;
                if( best == alpha_gain.begin() )
                    alpha = best->first / 2.0;
                else if( best == last ) {
                    if( nan == alpha_gain.end() )
                        alpha = (1.0 + best->first) / 2.0;
                    else
                        alpha = (nan->first + best->first) / 2.0;
                } else {
                    // fit a parabola through three points around best
                    best--; double x1 = best->first; double y1 = best->second;
                    best++; double x2 = best->first; double y2 = best->second;
                    best++; double x3 = best->first; double y3 = best->second;
                    assert( y1 <= y2 );
                    assert( y3 <= y2 );
                    if( (x3 - x1) < Props.tol || !((y2 < y1) && (y2 < y3)) )
                        alpha = x2;
                    else { // this is unstable if (x3-x1) becomes too small...
                        if( Props.verbose >= 3 ) {
                            cout << "  fitting parabola through ";
                            cout.precision( 15 );
                            cout << "(x1,y1) = (" << x1 << "," << y1 << "), ";
                            cout << "(x2,y2) = (" << x2 << "," << y2 << "), ";
                            cout << "(x3,y3) = (" << x3 << "," << y3 << ")." << endl;
                        }
                        alpha = 0.5 * (x1*x1*(y3-y2) + x2*x2*(y1-y3) + x3*x3*(y2-y1)) / (x1*(y3-y2) + x2*(y1-y3) + x3*(y2-y1));
                    }
                    assert( 0.0 < alpha );
                    assert( alpha < 1.0 );
                    assert( x1 <= alpha );
                    if( !(alpha <= x3) ) {
                        cerr.precision( 15 );
                        cerr << "alpha = " << alpha << endl;
                        cerr << "(x1,y1) = (" << x1 << "," << y1 << "), ";
                        cerr << "(x2,y2) = (" << x2 << "," << y2 << "), ";
                        cerr << "(x3,y3) = (" << x3 << "," << y3 << ")." << endl;
                        if( (x3 - x1) < Props.tol || !((y2 < y1) && (y2 < y3)) )
                            cerr << "used alpha = x2" << endl;
                        else
                            cerr << "fitted parabola" << endl;
                    }
                    assert( alpha <= x3 );
                    ready = true;
                }
                if( alpha < Props.tol ) {
                    alpha = 0.0;    // stay where you are in this case
                    _rho_e = cur_rho;
                    // calculate everything at rho_e
                    inner_loop();
                    cur_logZ = real(logZ());
                }
            } while( alpha > Props.tol ); 
            assert( !std::isnan(cur_logZ) );
            if( Props.verbose >= 3 ) {
                cout << "Accepted alpha = " << alpha << ", this gives improvement of logZ of " << prev_logZ - cur_logZ << endl;
            }

            if( fabs( cur_logZ - prev_logZ ) < Props.outertol )  {
                if( Props.verbose >= 1 )
                    cout << "Reached tolerance! Ready!" << endl;
                break; // reached tolerance
            }
            prev_logZ = cur_logZ;
        }

        assert( !std::isnan( cur_logZ ) );
        assert( !std::isnan( prev_logZ ) );
        return( fabs( cur_logZ - prev_logZ ) );
    }